

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O0

void __thiscall crnlib::dxt1_endpoint_optimizer::return_solution(dxt1_endpoint_optimizer *this)

{
  uint uVar1;
  uint uVar2;
  uint8 *__s;
  uint8 uVar3;
  uint uVar4;
  value_type *pvVar5;
  byte *pbVar6;
  uint8 *puVar7;
  uint local_d4;
  undefined4 *local_d0;
  undefined1 local_b8 [4];
  uint unique_color_index_1;
  undefined1 local_a8 [8];
  const_iterator it_1;
  uint uStack_90;
  uint8 selector_1;
  uint32 c_1;
  uint32 prev_color;
  uint8 prev_selector;
  uint8 *pDst_selectors_end;
  uint selector;
  uint unique_color_index;
  undefined1 local_68 [8];
  const_iterator it;
  uint8 *puStack_50;
  uint32 c;
  uint8 *pDst_selectors;
  uint32 *pSrc_pixels;
  undefined4 *puStack_38;
  uint alpha_thresh;
  uint8 *pInvert_table;
  bool invert_selectors;
  dxt1_endpoint_optimizer *this_local;
  
  compute_selectors(this);
  if (((this->m_best_solution).m_alpha_block & 1U) == 0) {
    pInvert_table._7_1_ =
         (this->m_best_solution).m_coords.m_low_color <
         (this->m_best_solution).m_coords.m_high_color;
  }
  else {
    pInvert_table._7_1_ =
         (this->m_best_solution).m_coords.m_high_color <
         (this->m_best_solution).m_coords.m_low_color;
  }
  this->m_pResults->m_alternate_rounding = (bool)((this->m_best_solution).m_alternate_rounding & 1);
  this->m_pResults->m_enforce_selector = (bool)((this->m_best_solution).m_enforce_selector & 1);
  this->m_pResults->m_enforced_selector = (this->m_best_solution).m_enforced_selector;
  this->m_pResults->m_reordered = pInvert_table._7_1_;
  if (pInvert_table._7_1_ == false) {
    this->m_pResults->m_low_color = (this->m_best_solution).m_coords.m_low_color;
    this->m_pResults->m_high_color = (this->m_best_solution).m_coords.m_high_color;
  }
  else {
    this->m_pResults->m_low_color = (this->m_best_solution).m_coords.m_high_color;
    this->m_pResults->m_high_color = (this->m_best_solution).m_coords.m_low_color;
  }
  puStack_38 = &g_invTableNull;
  if (pInvert_table._7_1_ != false) {
    if (((this->m_best_solution).m_alpha_block & 1U) == 0) {
      local_d0 = &g_invTableColor;
    }
    else {
      local_d0 = &g_invTableAlpha;
    }
    puStack_38 = local_d0;
  }
  if ((this->m_pParams->m_pixels_have_alpha & 1U) == 0) {
    local_d4 = 0;
  }
  else {
    local_d4 = this->m_pParams->m_dxt1a_alpha_threshold << 0x18;
  }
  pDst_selectors = (uint8 *)this->m_pParams->m_pPixels;
  __s = this->m_pResults->m_pSelectors;
  uVar4 = vector<crnlib::unique_color>::size(&this->m_unique_colors);
  if ((uVar4 == 1) && ((this->m_pParams->m_pixels_have_alpha & 1U) == 0)) {
    it._12_4_ = *(anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)pDst_selectors |
                0xff000000;
    hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
    ::find((hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
            *)&selector,(uint *)&this->m_unique_color_hash_map);
    hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
    ::const_iterator::const_iterator((const_iterator *)local_68,(iterator *)&selector);
    pvVar5 = hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
             ::const_iterator::operator->((const_iterator *)local_68);
    pbVar6 = vector<unsigned_char>::operator[](&(this->m_best_solution).m_selectors,pvVar5->second);
    memset(__s,(uint)*(byte *)((long)puStack_38 + (ulong)*pbVar6),
           (ulong)this->m_pParams->m_num_pixels);
  }
  else {
    uVar1 = this->m_pParams->m_num_pixels;
    c_1._3_1_ = '\0';
    uStack_90 = 0;
    puStack_50 = __s;
    do {
      uVar2 = *(uint *)pDst_selectors;
      pDst_selectors = pDst_selectors + 4;
      it_1.m_index._3_1_ = '\x03';
      uVar3 = it_1.m_index._3_1_;
      if ((local_d4 <= uVar2) &&
         (it_1._12_4_ = uVar2 | 0xff000000, uVar3 = c_1._3_1_, it_1._12_4_ != uStack_90)) {
        hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
        ::find((hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
                *)local_b8,(uint *)&this->m_unique_color_hash_map);
        hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
        ::const_iterator::const_iterator((const_iterator *)local_a8,(iterator *)local_b8);
        pvVar5 = hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
                 ::const_iterator::operator->((const_iterator *)local_a8);
        pbVar6 = vector<unsigned_char>::operator[]
                           (&(this->m_best_solution).m_selectors,pvVar5->second);
        c_1._3_1_ = *(uint8 *)((long)puStack_38 + (ulong)*pbVar6);
        uStack_90 = it_1._12_4_;
        uVar3 = c_1._3_1_;
      }
      it_1.m_index._3_1_ = uVar3;
      puVar7 = puStack_50 + 1;
      *puStack_50 = it_1.m_index._3_1_;
      puStack_50 = puVar7;
    } while (puVar7 != __s + uVar1);
  }
  this->m_pResults->m_alpha_block = (bool)((this->m_best_solution).m_alpha_block & 1);
  this->m_pResults->m_error = (this->m_best_solution).m_error;
  return;
}

Assistant:

void dxt1_endpoint_optimizer::return_solution()
    {
        compute_selectors();
        bool invert_selectors;

        if (m_best_solution.m_alpha_block)
        {
            invert_selectors = (m_best_solution.m_coords.m_low_color > m_best_solution.m_coords.m_high_color);
        }
        else
        {
            CRNLIB_ASSERT(m_best_solution.m_coords.m_low_color != m_best_solution.m_coords.m_high_color);

            invert_selectors = (m_best_solution.m_coords.m_low_color < m_best_solution.m_coords.m_high_color);
        }

        m_pResults->m_alternate_rounding = m_best_solution.m_alternate_rounding;
        m_pResults->m_enforce_selector = m_best_solution.m_enforce_selector;
        m_pResults->m_enforced_selector = m_best_solution.m_enforced_selector;
        m_pResults->m_reordered = invert_selectors;
        if (invert_selectors)
        {
            m_pResults->m_low_color = m_best_solution.m_coords.m_high_color;
            m_pResults->m_high_color = m_best_solution.m_coords.m_low_color;
        }
        else
        {
            m_pResults->m_low_color = m_best_solution.m_coords.m_low_color;
            m_pResults->m_high_color = m_best_solution.m_coords.m_high_color;
        }

        const uint8* pInvert_table = g_invTableNull;
        if (invert_selectors)
        {
            pInvert_table = m_best_solution.m_alpha_block ? g_invTableAlpha : g_invTableColor;
        }

        const uint alpha_thresh = m_pParams->m_pixels_have_alpha ? (m_pParams->m_dxt1a_alpha_threshold << 24U) : 0;

        const uint32* pSrc_pixels = reinterpret_cast<const uint32*>(m_pParams->m_pPixels);
        uint8* pDst_selectors = m_pResults->m_pSelectors;

        if ((m_unique_colors.size() == 1) && (!m_pParams->m_pixels_have_alpha))
        {
            uint32 c = utils::read_le32(pSrc_pixels);

            CRNLIB_ASSERT(c >= alpha_thresh);

            c |= 0xFF000000U;

            unique_color_hash_map::const_iterator it(m_unique_color_hash_map.find(c));
            CRNLIB_ASSERT(it != m_unique_color_hash_map.end());

            uint unique_color_index = it->second;

            uint selector = pInvert_table[m_best_solution.m_selectors[unique_color_index]];

            memset(pDst_selectors, selector, m_pParams->m_num_pixels);
        }
        else
        {
            uint8* pDst_selectors_end = pDst_selectors + m_pParams->m_num_pixels;

            uint8 prev_selector = 0;
            uint32 prev_color = 0;

            do
            {
                uint32 c = utils::read_le32(pSrc_pixels);
                pSrc_pixels++;

                uint8 selector = 3;

                if (c >= alpha_thresh)
                {
                    c |= 0xFF000000U;

                    if (c == prev_color)
                    {
                        selector = prev_selector;
                    }
                    else
                    {
                        unique_color_hash_map::const_iterator it(m_unique_color_hash_map.find(c));

                        CRNLIB_ASSERT(it != m_unique_color_hash_map.end());

                        uint unique_color_index = it->second;

                        selector = pInvert_table[m_best_solution.m_selectors[unique_color_index]];

                        prev_color = c;
                        prev_selector = selector;
                    }
                }

                *pDst_selectors++ = selector;
            } while (pDst_selectors != pDst_selectors_end);
        }

        m_pResults->m_alpha_block = m_best_solution.m_alpha_block;
        m_pResults->m_error = m_best_solution.m_error;
    }